

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteTargetRebuildManifest(cmGlobalNinjaGenerator *this,ostream *os)

{
  string *psVar1;
  cmLocalGenerator *this_00;
  pointer ppcVar2;
  pointer pbVar3;
  cmake *pcVar4;
  bool bVar5;
  byte bVar6;
  string *psVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  pointer ppcVar10;
  string *fi;
  pointer path;
  string verifyScriptFile;
  string verifyStampFile;
  cmNinjaBuild vgBuild;
  cmNinjaRule rule;
  cmNinjaBuild reBuild;
  allocator<char> local_4c9;
  ostream *local_4c8;
  cmOutputConverter *local_4c0;
  string local_4b8;
  string local_498;
  cmNinjaBuild local_478;
  undefined1 local_370 [64];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_330 [32];
  char local_310 [192];
  bool local_250;
  undefined1 local_1f8 [112];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_4c8 = os;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_370,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)local_1f8);
  bVar5 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)local_370);
  std::__cxx11::string::~string((string *)local_370);
  if (bVar5) {
    return;
  }
  this_00 = *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"RERUN_CMAKE",(allocator<char> *)local_1f8);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_370,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  CMakeCmd_abi_cxx11_((string *)local_1f8,this);
  psVar1 = (string *)(local_370 + 0x20);
  std::__cxx11::string::operator=(psVar1,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::append((char *)psVar1);
  psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(this_00);
  local_4c0 = &this_00->super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat((string *)local_1f8,local_4c0,psVar7,SHELL);
  std::__cxx11::string::append(psVar1);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::append((char *)psVar1);
  psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
  cmOutputConverter::ConvertToOutputFormat((string *)local_1f8,local_4c0,psVar7,SHELL);
  std::__cxx11::string::append(psVar1);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::assign((char *)local_330);
  std::__cxx11::string::assign(local_310);
  local_250 = true;
  WriteRule((ostream *)
            (this->RulesFileStream)._M_t.
            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
            (cmNinjaRule *)local_370);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"RERUN_CMAKE",(allocator<char> *)local_370);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_1f8,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::assign((char *)local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,NINJA_BUILD_FILE,(allocator<char> *)&local_4b8);
  NinjaOutputPath((string *)local_370,this,&local_478.Comment);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_1f8 + 0x40)
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370);
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::~string((string *)&local_478);
  ppcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar10 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar10 != ppcVar2;
      ppcVar10 = ppcVar10 + 1) {
    pbVar3 = ((*ppcVar10)->Makefile->ListFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (path = ((*ppcVar10)->Makefile->ListFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; path != pbVar3; path = path + 1) {
      psVar7 = ConvertToNinjaPath(this,path);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_170,psVar7);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_170,&this->CMakeCacheFile);
  if (this->NinjaSupportsConsolePool == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_370,"pool",(allocator<char> *)&local_478);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_140,(key_type *)local_370);
    std::__cxx11::string::assign((char *)pmVar8);
    std::__cxx11::string::~string((string *)local_370);
  }
  pcVar4 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  bVar6 = this->NinjaSupportsManifestRestat;
  if ((bool)bVar6 == true) {
    bVar5 = cmake::DoWriteGlobVerifyTarget(pcVar4);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"VERIFY_GLOBS",(allocator<char> *)&local_478);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_370,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      CMakeCmd_abi_cxx11_(&local_478.Comment,this);
      psVar1 = (string *)(local_370 + 0x20);
      std::__cxx11::string::operator=(psVar1,(string *)&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::append((char *)psVar1);
      psVar7 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
      cmOutputConverter::ConvertToOutputFormat(&local_478.Comment,local_4c0,psVar7,SHELL);
      std::__cxx11::string::append(psVar1);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::assign((char *)local_330);
      std::__cxx11::string::assign(local_310);
      local_250 = true;
      WriteRule((ostream *)
                (this->RulesFileStream)._M_t.
                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                (cmNinjaRule *)local_370);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_370);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"phony",(allocator<char> *)&local_478);
      cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_370,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::assign((char *)local_370);
      psVar7 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
      std::operator+(&local_478.Comment,psVar7,"_force");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_330,&local_478.Comment);
      std::__cxx11::string::~string((string *)&local_478);
      WriteBuild(this,local_4c8,(cmNinjaBuild *)local_370,0,(bool *)0x0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,"restat",(allocator<char> *)&local_4b8);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_140,&local_478.Comment);
      std::__cxx11::string::assign((char *)pmVar8);
      std::__cxx11::string::~string((string *)&local_478);
      psVar7 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
      NinjaOutputPath(&local_4b8,this,psVar7);
      psVar7 = cmake::GetGlobVerifyStamp_abi_cxx11_(pcVar4);
      NinjaOutputPath(&local_498,this,psVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"VERIFY_GLOBS",&local_4c9);
      cmNinjaBuild::cmNinjaBuild(&local_478,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::assign((char *)&local_478);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_478.Outputs,&local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_478.ImplicitDeps,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_330);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&local_478.Variables._M_t,&local_140);
      WriteBuild(this,local_4c8,&local_478,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild(&local_478);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"restat",&local_4c9);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&local_140,&local_478.Comment);
      std::__cxx11::string::~string((string *)&local_478);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_170,&local_4b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_188,&local_498);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_4b8);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_370);
      goto LAB_001d2656;
    }
    bVar6 = this->NinjaSupportsManifestRestat;
  }
  if (((bVar6 & 1) == 0) && (bVar5 = cmake::DoWriteGlobVerifyTarget(pcVar4), bVar5)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
    poVar9 = std::operator<<((ostream *)local_370,"The detected version of Ninja:\n");
    poVar9 = std::operator<<(poVar9,"  ");
    poVar9 = std::operator<<(poVar9,(string *)&this->NinjaVersion);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,
                             "is less than the version of Ninja required by CMake for adding restat dependencies to the build.ninja manifest regeneration target:\n"
                            );
    poVar9 = std::operator<<(poVar9,"  ");
    RequiredNinjaVersionForManifestRestat_abi_cxx11_();
    poVar9 = std::operator<<(poVar9,(string *)&local_478);
    std::operator<<(poVar9,"\n");
    std::__cxx11::string::~string((string *)&local_478);
    std::operator<<((ostream *)local_370,
                    "Any pre-check scripts, such as those generated for file(GLOB CONFIGURE_DEPENDS), will not be run by Ninja."
                   );
    pcVar4 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    local_4b8._M_dataplus._M_p = (pointer)0x0;
    local_4b8._M_string_length = 0;
    cmake::IssueMessage(pcVar4,AUTHOR_WARNING,&local_478.Comment,(cmListFileBacktrace *)&local_4b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4b8._M_string_length);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
  }
LAB_001d2656:
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_170[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_170[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_170[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_170[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(local_170,(const_iterator)__first._M_current,
          (const_iterator)
          local_170[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  WriteBuild(this,local_4c8,(cmNinjaBuild *)local_1f8,0,(bool *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"phony",(allocator<char> *)&local_478);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_370,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::assign((char *)local_370);
  std::
  __set_difference<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_170[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_170[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  WriteBuild(this,local_4c8,(cmNinjaBuild *)local_370,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_370);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_1f8);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetRebuildManifest(std::ostream& os)
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }
  cmLocalGenerator* lg = this->LocalGenerators[0];

  {
    cmNinjaRule rule("RERUN_CMAKE");
    rule.Command = CMakeCmd();
    rule.Command += " -S";
    rule.Command += lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                              cmOutputConverter::SHELL);
    rule.Command += " -B";
    rule.Command += lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                              cmOutputConverter::SHELL);
    rule.Description = "Re-running CMake...";
    rule.Comment = "Rule for re-running cmake.";
    rule.Generator = true;
    WriteRule(*this->RulesFileStream, rule);
  }

  cmNinjaBuild reBuild("RERUN_CMAKE");
  reBuild.Comment = "Re-run CMake if any of its inputs changed.";
  reBuild.Outputs.push_back(this->NinjaOutputPath(NINJA_BUILD_FILE));

  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    for (std::string const& fi : localGen->GetMakefile()->GetListFiles()) {
      reBuild.ImplicitDeps.push_back(this->ConvertToNinjaPath(fi));
    }
  }
  reBuild.ImplicitDeps.push_back(this->CMakeCacheFile);

  // Use 'console' pool to get non buffered output of the CMake re-run call
  // Available since Ninja 1.5
  if (SupportsConsolePool()) {
    reBuild.Variables["pool"] = "console";
  }

  cmake* cm = this->GetCMakeInstance();
  if (this->SupportsManifestRestat() && cm->DoWriteGlobVerifyTarget()) {
    {
      cmNinjaRule rule("VERIFY_GLOBS");
      rule.Command = CMakeCmd();
      rule.Command += " -P ";
      rule.Command += lg->ConvertToOutputFormat(cm->GetGlobVerifyScript(),
                                                cmOutputConverter::SHELL);
      rule.Description = "Re-checking globbed directories...";
      rule.Comment = "Rule for re-checking globbed directories.";
      rule.Generator = true;
      this->WriteRule(*this->RulesFileStream, rule);
    }

    cmNinjaBuild phonyBuild("phony");
    phonyBuild.Comment = "Phony target to force glob verification run.";
    phonyBuild.Outputs.push_back(cm->GetGlobVerifyScript() + "_force");
    this->WriteBuild(os, phonyBuild);

    reBuild.Variables["restat"] = "1";
    std::string const verifyScriptFile =
      this->NinjaOutputPath(cm->GetGlobVerifyScript());
    std::string const verifyStampFile =
      this->NinjaOutputPath(cm->GetGlobVerifyStamp());
    {
      cmNinjaBuild vgBuild("VERIFY_GLOBS");
      vgBuild.Comment =
        "Re-run CMake to check if globbed directories changed.";
      vgBuild.Outputs.push_back(verifyStampFile);
      vgBuild.ImplicitDeps = phonyBuild.Outputs;
      vgBuild.Variables = reBuild.Variables;
      this->WriteBuild(os, vgBuild);
    }
    reBuild.Variables.erase("restat");
    reBuild.ImplicitDeps.push_back(verifyScriptFile);
    reBuild.ExplicitDeps.push_back(verifyStampFile);
  } else if (!this->SupportsManifestRestat() &&
             cm->DoWriteGlobVerifyTarget()) {
    std::ostringstream msg;
    msg << "The detected version of Ninja:\n"
        << "  " << this->NinjaVersion << "\n"
        << "is less than the version of Ninja required by CMake for adding "
           "restat dependencies to the build.ninja manifest regeneration "
           "target:\n"
        << "  "
        << cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat()
        << "\n";
    msg << "Any pre-check scripts, such as those generated for file(GLOB "
           "CONFIGURE_DEPENDS), will not be run by Ninja.";
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           msg.str());
  }

  std::sort(reBuild.ImplicitDeps.begin(), reBuild.ImplicitDeps.end());
  reBuild.ImplicitDeps.erase(
    std::unique(reBuild.ImplicitDeps.begin(), reBuild.ImplicitDeps.end()),
    reBuild.ImplicitDeps.end());

  this->WriteBuild(os, reBuild);

  {
    cmNinjaBuild build("phony");
    build.Comment = "A missing CMake input file is not an error.";
    std::set_difference(std::make_move_iterator(reBuild.ImplicitDeps.begin()),
                        std::make_move_iterator(reBuild.ImplicitDeps.end()),
                        CustomCommandOutputs.begin(),
                        CustomCommandOutputs.end(),
                        std::back_inserter(build.Outputs));
    this->WriteBuild(os, build);
  }
}